

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAInitialSetup(IDAMem IDA_mem)

{
  int iVar1;
  IDAMem in_RDI;
  int ier;
  int conOK;
  int in_stack_ffffffffffffffec;
  int local_4;
  
  if ((in_RDI->ida_suppressalg == 0) ||
     (in_RDI->ida_phi[0]->ops->nvwrmsnormmask != (_func_sunrealtype_N_Vector_N_Vector_N_Vector *)0x0
     )) {
    if ((in_RDI->ida_suppressalg == 0) || (in_RDI->ida_id != (N_Vector)0x0)) {
      if (in_RDI->ida_itol == 0) {
        IDAProcessError(in_RDI,-0x16,0x7d5,"IDAInitialSetup",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                        ,"No integration tolerances have been specified.");
        local_4 = -0x16;
      }
      else {
        if (in_RDI->ida_user_efun == 0) {
          in_RDI->ida_edata = in_RDI;
        }
        else {
          in_RDI->ida_edata = in_RDI->ida_user_data;
        }
        iVar1 = (*in_RDI->ida_efun)(in_RDI->ida_phi[0],in_RDI->ida_ewt,in_RDI->ida_edata);
        if (iVar1 == 0) {
          if ((in_RDI->ida_constraintsSet == 0) ||
             (in_stack_ffffffffffffffec =
                   N_VConstrMask(in_RDI->ida_constraints,in_RDI->ida_phi[0],in_RDI->ida_tempv2),
             in_stack_ffffffffffffffec != 0)) {
            if (in_RDI->ida_linit != (_func_int_IDAMemRec_ptr *)0x0) {
              iVar1 = (*in_RDI->ida_linit)(in_RDI);
              if (iVar1 != 0) {
                IDAProcessError(in_RDI,-5,0x803,"IDAInitialSetup",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                                ,"The linear solver\'s init routine failed.");
                return -5;
              }
              iVar1 = 0;
            }
            iVar1 = idaNlsInit((IDAMem)CONCAT44(in_stack_ffffffffffffffec,iVar1));
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              IDAProcessError(in_RDI,-0xf,0x80e,"IDAInitialSetup",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                              ,"The nonlinear solver\'s init routine failed.");
              local_4 = -0xf;
            }
          }
          else {
            IDAProcessError(in_RDI,-0x16,0x7f7,"IDAInitialSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                            ,"y0 fails to satisfy constraints.");
            local_4 = -0x16;
          }
        }
        else {
          if (in_RDI->ida_itol == 3) {
            IDAProcessError(in_RDI,-0x16,0x7e5,"IDAInitialSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                            ,"The user-provide EwtSet function failed.");
          }
          else {
            IDAProcessError(in_RDI,-0x16,0x7ea,"IDAInitialSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                            ,"Some initial ewt component = 0.0 illegal.");
          }
          local_4 = -0x16;
        }
      }
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x7cd,"IDAInitialSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                      ,"id = NULL but suppressalg option on.");
      local_4 = -0x16;
    }
  }
  else {
    IDAProcessError(in_RDI,-0x16,0x7c4,"IDAInitialSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"A required vector operation is not implemented.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDAInitialSetup(IDAMem IDA_mem)
{
  sunbooleantype conOK;
  int ier;

  /* Test for more vector operations, depending on options */
  if (IDA_mem->ida_suppressalg)
  {
    if (IDA_mem->ida_phi[0]->ops->nvwrmsnormmask == NULL)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_NVECTOR);
      return (IDA_ILL_INPUT);
    }
  }

  /* Test id vector for legality */
  if (IDA_mem->ida_suppressalg && (IDA_mem->ida_id == NULL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_MISSING_ID);
    return (IDA_ILL_INPUT);
  }

  /* Did the user specify tolerances? */
  if (IDA_mem->ida_itol == IDA_NN)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_TOLS);
    return (IDA_ILL_INPUT);
  }

  /* Set data for efun */
  if (IDA_mem->ida_user_efun) { IDA_mem->ida_edata = IDA_mem->ida_user_data; }
  else { IDA_mem->ida_edata = IDA_mem; }

  /* Initial error weight vector */
  ier = IDA_mem->ida_efun(IDA_mem->ida_phi[0], IDA_mem->ida_ewt,
                          IDA_mem->ida_edata);
  if (ier != 0)
  {
    if (IDA_mem->ida_itol == IDA_WF)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_FAIL_EWT);
    }
    else
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_EWT);
    }
    return (IDA_ILL_INPUT);
  }

  /* Check to see if y0 satisfies constraints. */
  if (IDA_mem->ida_constraintsSet)
  {
    conOK = N_VConstrMask(IDA_mem->ida_constraints, IDA_mem->ida_phi[0],
                          IDA_mem->ida_tempv2);
    if (!conOK)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_Y0_FAIL_CONSTR);
      return (IDA_ILL_INPUT);
    }
  }

  /* Call linit function if it exists. */
  if (IDA_mem->ida_linit != NULL)
  {
    ier = IDA_mem->ida_linit(IDA_mem);
    if (ier != 0)
    {
      IDAProcessError(IDA_mem, IDA_LINIT_FAIL, __LINE__, __func__, __FILE__,
                      MSG_LINIT_FAIL);
      return (IDA_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver (must occur after linear solver is initialize) so
   * that lsetup and lsolve pointers have been set */
  ier = idaNlsInit(IDA_mem);
  if (ier != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_NLS_INIT_FAIL, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (IDA_NLS_INIT_FAIL);
  }

  return (IDA_SUCCESS);
}